

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  uint *puVar1;
  ulong uVar2;
  undefined1 auVar3 [64];
  ushort uVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [64];
  byte bVar10;
  uint uVar11;
  uchar *puVar12;
  uint *puVar13;
  undefined1 (*bitlen) [64];
  undefined1 (*bitlen_00) [64];
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  size_t __size;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  byte bVar24;
  undefined4 *puVar25;
  int iVar26;
  ulong uVar27;
  undefined4 *puVar28;
  uint result_2;
  int iVar29;
  uint result;
  int iVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  HuffmanTree tree_ll;
  ulong local_128;
  size_t local_120;
  uint *local_118;
  uchar *local_108;
  ulong local_f0;
  ulong local_e8;
  uint local_dc;
  undefined1 local_a8 [16];
  uint *local_98;
  uint local_8c;
  undefined1 local_88 [16];
  uint *local_78;
  uint local_6c;
  undefined1 local_68 [16];
  uint *local_58;
  uint local_4c;
  uchar **local_40;
  ulong *local_38;
  
  local_f0 = *outsize;
  local_108 = *out;
  uVar2 = insize * 8;
  uVar23 = 0;
  uVar22 = 0;
  bVar14 = 0;
  local_e8 = local_f0;
  local_40 = out;
  local_38 = outsize;
LAB_002b610a:
  if (bVar14 != 0) {
    local_dc = 0;
    goto LAB_002b6f33;
  }
  uVar21 = uVar23 + 2;
  local_dc = 0x34;
  if (uVar2 <= uVar21) goto LAB_002b6f33;
  local_128 = uVar23 + 3;
  bVar14 = in[uVar23 >> 3];
  bVar10 = (in[uVar21 >> 3] >> ((byte)uVar21 & 7)) * '\x02' & 2 |
           (in[uVar23 + 1 >> 3] >> ((uint)(uVar23 + 1) & 7) & 1) != 0;
  bVar24 = (byte)uVar23;
  if (bVar10 == 0) {
    uVar16 = (ulong)((uint)local_128 & 7);
    uVar21 = uVar23 + 4 + (uVar16 ^ 7);
    if (uVar16 == 0) {
      uVar21 = local_128;
    }
    uVar21 = uVar21 >> 3;
    uVar23 = uVar21 + 4;
    if (insize <= uVar23) goto LAB_002b6f33;
    uVar4 = *(ushort *)(in + uVar21);
    uVar15 = (uint)uVar4;
    uVar11 = (uint)uVar4;
    if (*(ushort *)(in + uVar21 + 2) + uVar11 == 0xffff) {
      uVar21 = uVar22 + uVar11;
      puVar12 = local_108;
      if (local_e8 < uVar21) {
        uVar16 = local_e8 * 2;
        local_e8 = uVar21 * 3 >> 1;
        if (uVar16 < uVar21) {
          local_e8 = uVar21;
        }
        puVar12 = (uchar *)realloc(local_108,local_e8);
        if (puVar12 == (uchar *)0x0) {
          local_dc = 0x53;
          goto LAB_002b6f33;
        }
      }
      local_108 = puVar12;
      local_f0 = uVar21;
      if (uVar11 + uVar23 <= insize) {
        if (uVar4 != 0) {
          do {
            puVar12 = in + uVar23;
            uVar23 = uVar23 + 1;
            local_108[uVar22] = *puVar12;
            uVar22 = uVar22 + 1;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
        uVar23 = uVar23 << 3;
        local_dc = 0;
        goto LAB_002b67a8;
      }
      local_dc = 0x17;
      goto LAB_002b6f33;
    }
    local_dc = 0x15;
  }
  else {
    if (bVar10 != 3) {
      local_88 = (undefined1  [16])0x0;
      local_78 = (uint *)0x0;
      local_a8 = (undefined1  [16])0x0;
      local_98 = (uint *)0x0;
      if (bVar10 != 2) {
        if (bVar10 == 1) {
          generateFixedLitLenTree((HuffmanTree *)local_88);
          generateFixedDistanceTree((HuffmanTree *)local_a8);
          uVar11 = local_6c;
          uVar15 = local_8c;
          puVar13 = (uint *)local_88._0_8_;
          local_118 = (uint *)local_a8._0_8_;
        }
        else {
          local_118 = (uint *)0x0;
          uVar11 = local_6c;
          uVar15 = local_8c;
          puVar13 = (uint *)0x0;
        }
        goto LAB_002b643d;
      }
      uVar21 = uVar23 + 0x11;
      local_dc = 0x31;
      if (uVar2 < uVar21) {
LAB_002b640c:
        local_118 = (uint *)0x0;
        puVar13 = (uint *)0x0;
      }
      else {
        uVar11 = 0;
        iVar31 = 0;
        do {
          iVar26 = iVar31;
          uVar16 = local_128 >> 3;
          bVar10 = (byte)local_128;
          local_128 = local_128 + 1;
          iVar29 = (in[uVar16] >> (bVar10 & 7) & 1) << (uVar11 & 0x1f);
          uVar11 = uVar11 + 1;
          iVar31 = iVar29 + iVar26;
        } while (uVar11 != 5);
        uVar23 = uVar23 + 8;
        uVar11 = 0;
        iVar30 = 0;
        do {
          uVar16 = uVar23 >> 3;
          bVar10 = (byte)uVar23;
          uVar23 = uVar23 + 1;
          uVar15 = uVar11 & 0x1f;
          uVar11 = uVar11 + 1;
          iVar30 = iVar30 + ((in[uVar16] >> (bVar10 & 7) & 1) << uVar15);
        } while (uVar11 != 5);
        auVar34 = vpmovsxbd_avx(ZEXT416(0x3020100));
        auVar35 = vpbroadcastq_avx512vl();
        auVar35 = vpaddq_avx2(auVar35,_DAT_003c74a0);
        auVar32 = vpbroadcastd_avx512vl();
        auVar32 = vpaddd_avx(auVar32,auVar34);
        auVar33._8_4_ = 7;
        auVar33._0_8_ = 0x700000007;
        auVar33._12_4_ = 7;
        auVar33 = vpandd_avx512vl(auVar32,auVar33);
        auVar35 = vpsrlq_avx2(auVar35,3);
        lVar17 = vpextrq_avx(auVar35._0_16_,1);
        lVar20 = vpextrq_avx(auVar35._16_16_,1);
        auVar32 = vpinsrb_avx(ZEXT116(in[auVar35._0_8_]),(uint)in[lVar17],4);
        auVar32 = vpinsrb_avx(auVar32,(uint)in[auVar35._16_8_],8);
        auVar32 = vpinsrb_avx(auVar32,(uint)in[lVar20],0xc);
        auVar32 = vpsrlvd_avx2(auVar32,auVar33);
        auVar7._8_4_ = 1;
        auVar7._0_8_ = 0x100000001;
        auVar7._12_4_ = 1;
        auVar32 = vpandd_avx512vl(auVar32,auVar7);
        auVar32 = vpsllvd_avx2(auVar32,auVar34);
        auVar32 = vpmovdb_avx512vl(auVar32);
        auVar32 = vpsadbw_avx(ZEXT416(auVar32._0_4_),(undefined1  [16])0x0);
        uVar11 = auVar32._0_4_ + 4;
        local_128 = uVar21;
        if (uVar2 < uVar11 * 3 + uVar21) {
          local_dc = 0x32;
          goto LAB_002b640c;
        }
        local_68 = (undefined1  [16])0x0;
        local_58 = (uint *)0x0;
        puVar13 = (uint *)malloc(0x4c);
        if (puVar13 == (uint *)0x0) {
          local_118 = (uint *)0x0;
          bitlen = (undefined1 (*) [64])0x0;
          bitlen_00 = (undefined1 (*) [64])0x0;
          local_dc = 0x53;
        }
        else {
          uVar15 = iVar31 + 0x101;
          uVar23 = 0;
          do {
            uVar18 = 0;
            if (uVar23 < uVar11) {
              uVar19 = 0;
              uVar18 = 0;
              uVar16 = uVar21;
              do {
                uVar27 = uVar16 >> 3;
                bVar10 = (byte)uVar16;
                uVar16 = uVar16 + 1;
                uVar6 = uVar19 & 0x1f;
                uVar19 = uVar19 + 1;
                uVar18 = uVar18 + ((in[uVar27] >> (bVar10 & 7) & 1) << uVar6);
              } while (uVar19 != 3);
              uVar21 = uVar21 + 3;
            }
            puVar1 = CLCL_ORDER + uVar23;
            uVar23 = uVar23 + 1;
            puVar13[*puVar1] = uVar18;
          } while (uVar23 != 0x13);
          local_dc = HuffmanTree_makeFromLengths((HuffmanTree *)local_68,puVar13,0x13,7);
          local_128 = uVar21;
          if (local_dc == 0) {
            bitlen = (undefined1 (*) [64])malloc(0x480);
            bitlen_00 = (undefined1 (*) [64])malloc(0x80);
            if (bitlen_00 == (undefined1 (*) [64])0x0 || bitlen == (undefined1 (*) [64])0x0) {
              local_118 = (uint *)0x0;
              local_dc = 0x53;
            }
            else {
              memset(bitlen,0,0x480);
              auVar3 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
              *bitlen_00 = auVar3;
              auVar3 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
              bitlen_00[1] = auVar3;
              uVar11 = iVar30 + iVar31 + 0x102U;
              if (uVar11 == 0) {
                local_dc = 0x40;
              }
              else {
                uVar23 = (ulong)uVar15;
                uVar21 = (ulong)uVar11;
                local_dc = 0;
                uVar18 = 0;
                iVar26 = -0x101 - (iVar29 + iVar26);
                do {
                  uVar16 = uVar2;
                  if (uVar2 < local_128) {
                    uVar16 = local_128;
                  }
                  uVar19 = 0;
                  uVar27 = local_128 + 4;
LAB_002b69a5:
                  local_128 = uVar27;
                  if (local_128 - uVar16 == 4) goto LAB_002b6d51;
                  uVar6 = *(uint *)(local_68._0_8_ +
                                   (ulong)((in[local_128 - 4 >> 3] >> ((char)local_128 - 4U & 7) & 1
                                           ) + uVar19 * 2) * 4);
                  uVar19 = uVar6 - local_4c;
                  if (local_4c <= uVar6) goto code_r0x002b69e0;
                  uVar16 = local_128 - 3;
                  if (0xf < uVar6) {
                    if (uVar6 == 0x12) {
                      if (local_128 + 4 <= uVar2) {
                        local_128 = local_128 + 4;
                        uVar19 = 0;
                        iVar29 = 0;
                        do {
                          uVar27 = uVar16 >> 3;
                          bVar10 = (byte)uVar16;
                          uVar16 = uVar16 + 1;
                          uVar6 = uVar19 & 0x1f;
                          uVar19 = uVar19 + 1;
                          iVar29 = iVar29 + ((in[uVar27] >> (bVar10 & 7) & 1) << uVar6);
                        } while (uVar19 != 7);
                        iVar29 = iVar29 + 0xb;
                        if (iVar29 != 0) {
                          uVar27 = (ulong)uVar18;
                          puVar25 = (undefined4 *)(*bitlen + uVar27 * 4);
                          uVar16 = uVar21;
                          if (uVar21 < uVar27) {
                            uVar16 = uVar27;
                          }
                          iVar30 = -uVar18;
                          do {
                            if (uVar16 == uVar27) {
                              uVar18 = -iVar30;
                              local_dc = 0xf;
                              goto LAB_002b6cb1;
                            }
                            puVar28 = (undefined4 *)
                                      (*bitlen_00 + (ulong)(uint)(iVar26 + (int)uVar27) * 4);
                            if (uVar27 < uVar23) {
                              puVar28 = puVar25;
                            }
                            uVar27 = uVar27 + 1;
                            iVar30 = iVar30 + -1;
                            puVar25 = puVar25 + 1;
                            iVar29 = iVar29 + -1;
                            *puVar28 = 0;
                          } while (iVar29 != 0);
LAB_002b6c90:
                          uVar18 = -iVar30;
                        }
                        goto LAB_002b6cb1;
                      }
                      local_dc = 0x32;
                    }
                    else if (uVar6 == 0x11) {
                      if (local_128 <= uVar2) {
                        uVar19 = 0;
                        iVar29 = 0;
                        do {
                          uVar27 = uVar16 >> 3;
                          bVar10 = (byte)uVar16;
                          uVar16 = uVar16 + 1;
                          uVar6 = uVar19 & 0x1f;
                          uVar19 = uVar19 + 1;
                          iVar29 = iVar29 + ((in[uVar27] >> (bVar10 & 7) & 1) << uVar6);
                        } while (uVar19 != 3);
                        iVar29 = iVar29 + 3;
                        if (iVar29 != 0) {
                          uVar27 = (ulong)uVar18;
                          puVar25 = (undefined4 *)(*bitlen + uVar27 * 4);
                          uVar16 = uVar21;
                          if (uVar21 < uVar27) {
                            uVar16 = uVar27;
                          }
                          iVar30 = -uVar18;
                          do {
                            if (uVar16 == uVar27) {
                              uVar18 = -iVar30;
                              local_dc = 0xe;
                              goto LAB_002b6cb1;
                            }
                            puVar28 = (undefined4 *)
                                      (*bitlen_00 + (ulong)(uint)(iVar26 + (int)uVar27) * 4);
                            if (uVar27 < uVar23) {
                              puVar28 = puVar25;
                            }
                            uVar27 = uVar27 + 1;
                            iVar30 = iVar30 + -1;
                            puVar25 = puVar25 + 1;
                            iVar29 = iVar29 + -1;
                            *puVar28 = 0;
                          } while (iVar29 != 0);
                          goto LAB_002b6c90;
                        }
                        goto LAB_002b6cb1;
                      }
                      local_dc = 0x32;
                    }
                    else if (uVar6 == 0x10) {
                      if (uVar18 == 0) {
                        local_dc = 0x36;
                      }
                      else {
                        if (local_128 - 1 <= uVar2) {
                          auVar32 = vpbroadcastq_avx512vl();
                          auVar32 = vpaddq_avx(auVar32,_DAT_0087f620);
                          auVar36._8_8_ = 0x100000000;
                          auVar36._0_8_ = 0x100000000;
                          local_128 = local_128 - 1;
                          auVar34 = vpbroadcastd_avx512vl();
                          auVar33 = vpsrlq_avx(auVar32,3);
                          auVar32 = vpaddd_avx(auVar34,auVar36);
                          auVar34._8_4_ = 7;
                          auVar34._0_8_ = 0x700000007;
                          auVar34._12_4_ = 7;
                          auVar34 = vpandd_avx512vl(auVar32,auVar34);
                          lVar17 = vpextrq_avx(auVar33,1);
                          auVar32 = vpinsrb_avx(ZEXT116(in[auVar33._0_8_]),(uint)in[lVar17],4);
                          auVar32 = vpsrlvd_avx2(auVar32,auVar34);
                          auVar8._8_4_ = 1;
                          auVar8._0_8_ = 0x100000001;
                          auVar8._12_4_ = 1;
                          auVar32 = vpandd_avx512vl(auVar32,auVar8);
                          puVar25 = (undefined4 *)
                                    (*bitlen_00 + (ulong)((uVar18 - iVar31) - 0x102) * 4);
                          if (uVar18 < iVar31 + 0x102U) {
                            puVar25 = (undefined4 *)(*bitlen + (ulong)(uVar18 - 1) * 4);
                          }
                          auVar32 = vpsllvd_avx2(auVar32,auVar36);
                          auVar32 = vphaddd_avx(auVar32,auVar32);
                          iVar29 = auVar32._0_4_ + 3;
                          if (iVar29 != 0) {
                            uVar5 = *puVar25;
                            uVar27 = (ulong)uVar18;
                            puVar25 = (undefined4 *)(*bitlen + uVar27 * 4);
                            uVar16 = uVar21;
                            if (uVar21 < uVar27) {
                              uVar16 = uVar27;
                            }
                            iVar30 = -uVar18;
                            do {
                              if (uVar16 == uVar27) {
                                uVar18 = -iVar30;
                                local_dc = 0xd;
                                goto LAB_002b6cb1;
                              }
                              puVar28 = (undefined4 *)
                                        (*bitlen_00 + (ulong)(uint)(iVar26 + (int)uVar27) * 4);
                              if (uVar27 < uVar23) {
                                puVar28 = puVar25;
                              }
                              uVar27 = uVar27 + 1;
                              iVar30 = iVar30 + -1;
                              puVar25 = puVar25 + 1;
                              iVar29 = iVar29 + -1;
                              *puVar28 = uVar5;
                            } while (iVar29 != 0);
                            uVar18 = -iVar30;
                          }
                          goto LAB_002b6cb1;
                        }
                        local_dc = 0x32;
                      }
                    }
                    else {
                      local_dc = 0x10;
                    }
                    local_118 = (uint *)0x0;
                    local_128 = local_128 - 3;
                    goto LAB_002b6d78;
                  }
                  uVar19 = uVar15;
                  pauVar9 = bitlen_00;
                  if (uVar18 < uVar15) {
                    uVar19 = 0;
                    pauVar9 = bitlen;
                  }
                  *(uint *)(*pauVar9 + (ulong)(uVar18 - uVar19) * 4) = uVar6;
                  uVar18 = uVar18 + 1;
                  local_128 = uVar16;
LAB_002b6cb1:
                } while (uVar18 < uVar11);
                if (local_dc == 0) {
                  if (*(int *)bitlen[0x10] == 0) {
                    local_dc = 0x40;
                  }
                  else {
                    local_dc = HuffmanTree_makeFromLengths
                                         ((HuffmanTree *)local_88,(uint *)bitlen,0x120,0xf);
                    if (local_dc == 0) {
                      local_dc = HuffmanTree_makeFromLengths
                                           ((HuffmanTree *)local_a8,(uint *)bitlen_00,0x20,0xf);
                      local_118 = (uint *)local_a8._0_8_;
                      goto LAB_002b6d78;
                    }
                  }
                }
              }
              local_118 = (uint *)0x0;
            }
          }
          else {
            local_118 = (uint *)0x0;
            bitlen = (undefined1 (*) [64])0x0;
            bitlen_00 = (undefined1 (*) [64])0x0;
          }
        }
LAB_002b6d78:
        free(puVar13);
        free(bitlen);
        free(bitlen_00);
        free((void *)local_68._0_8_);
        free((void *)local_68._8_8_);
        free(local_58);
        puVar13 = (uint *)local_88._0_8_;
        uVar11 = local_6c;
        uVar15 = local_8c;
        if (local_dc == 0) {
LAB_002b643d:
          while( true ) {
            uVar23 = uVar2;
            if (uVar2 < local_128) {
              uVar23 = local_128;
            }
            uVar18 = 0;
            uVar21 = local_128;
            while( true ) {
              uVar16 = uVar23;
              if (uVar23 == uVar21) goto LAB_002b672e;
              uVar16 = uVar21 + 1;
              uVar19 = puVar13[(in[uVar21 >> 3] >> ((byte)uVar21 & 7) & 1) + uVar18 * 2];
              uVar18 = uVar19 - uVar11;
              if (uVar19 < uVar11) break;
              uVar21 = uVar16;
              if (uVar11 <= uVar18) goto LAB_002b672e;
            }
            local_128 = uVar21 + 1;
            if (uVar19 < 0x100) break;
            if ((uVar19 == 0x100) || (0x11d < uVar19)) {
              local_dc = 0;
              uVar16 = uVar21 + 1;
              if (uVar19 == 0x100) {
LAB_002b6d19:
                local_128 = uVar21 + 1;
              }
              else {
LAB_002b672e:
                local_dc = 0xb - (uVar2 < uVar16);
                local_128 = uVar16;
              }
              goto LAB_002b6740;
            }
            uVar23 = (ulong)(uVar19 - 0x101);
            if (uVar2 < (ulong)LENGTHEXTRA[uVar23] + 1 + uVar21) {
              local_dc = 0x33;
              goto LAB_002b6d19;
            }
            if (uVar23 - 0x1c < 0xffffffffffffffec) {
              uVar21 = 0;
            }
            else {
              uVar18 = 0;
              uVar19 = 0;
              do {
                uVar21 = local_128 >> 3;
                bVar10 = (byte)local_128;
                local_128 = local_128 + 1;
                uVar6 = uVar18 & 0x1f;
                uVar18 = uVar18 + 1;
                uVar19 = uVar19 + ((in[uVar21] >> (bVar10 & 7) & 1) << uVar6);
              } while (LENGTHEXTRA[uVar23] != uVar18);
              uVar21 = (ulong)uVar19;
            }
            uVar21 = LENGTHBASE[uVar23] + uVar21;
            uVar23 = uVar2;
            if (uVar2 < local_128) {
              uVar23 = local_128;
            }
            uVar18 = 0;
            uVar16 = local_128;
            while( true ) {
              local_128 = uVar23;
              if (uVar23 == uVar16) goto LAB_002b68bd;
              local_128 = uVar16 + 1;
              uVar18 = local_118[(in[uVar16 >> 3] >> ((byte)uVar16 & 7) & 1) + uVar18 * 2];
              if (uVar18 < uVar15) break;
              uVar18 = uVar18 - uVar15;
              uVar16 = local_128;
              if (uVar15 <= uVar18) goto LAB_002b68bd;
            }
            if (0x1d < uVar18) {
LAB_002b68bd:
              local_dc = 0x12;
              goto LAB_002b6740;
            }
            if (uVar2 < (ulong)DISTANCEEXTRA[uVar18] + 1 + uVar16) {
              local_128 = uVar16 + 1;
              local_dc = 0x33;
              goto LAB_002b6740;
            }
            local_128 = uVar16 + 1;
            iVar31 = 0;
            if (3 < uVar18) {
              uVar19 = 0;
              iVar31 = 0;
              do {
                uVar23 = local_128 >> 3;
                bVar10 = (byte)local_128;
                local_128 = local_128 + 1;
                uVar6 = uVar19 & 0x1f;
                uVar19 = uVar19 + 1;
                iVar31 = iVar31 + ((in[uVar23] >> (bVar10 & 7) & 1) << uVar6);
              } while (DISTANCEEXTRA[uVar18] != uVar19);
            }
            uVar23 = (ulong)(iVar31 + DISTANCEBASE[uVar18]);
            if (uVar22 < uVar23) {
              local_dc = 0x34;
              goto LAB_002b6740;
            }
            uVar16 = uVar21 + uVar22;
            if (local_e8 < uVar16) {
              local_120 = uVar16 * 3 >> 1;
              if (local_e8 * 2 < uVar16) {
                local_120 = uVar16;
              }
              puVar12 = (uchar *)realloc(local_108,local_120);
              if (puVar12 == (uchar *)0x0) {
                local_dc = 0x53;
                goto LAB_002b6740;
              }
            }
            else {
              local_120 = local_e8;
              puVar12 = local_108;
            }
            local_108 = puVar12;
            if (uVar23 < uVar21) {
              do {
                local_108[uVar22] = local_108[uVar22 - uVar23];
                uVar22 = uVar22 + 1;
                uVar21 = uVar21 - 1;
              } while (uVar21 != 0);
            }
            else {
              memcpy(local_108 + uVar22,local_108 + (uVar22 - uVar23),uVar21);
              uVar22 = uVar16;
            }
            local_e8 = local_120;
            local_f0 = uVar16;
          }
          uVar23 = uVar22 + 1;
          __size = local_e8;
          puVar12 = local_108;
          if (local_e8 < uVar23) {
            __size = uVar23 * 3 >> 1;
            if (local_e8 * 2 < uVar23) {
              __size = uVar23;
            }
            puVar12 = (uchar *)realloc(local_108,__size);
            if (puVar12 == (uchar *)0x0) goto LAB_002b6ddf;
          }
          local_108 = puVar12;
          local_108[uVar22] = (uchar)uVar19;
          uVar22 = uVar23;
          local_f0 = uVar23;
          local_e8 = __size;
          goto LAB_002b643d;
        }
      }
      goto LAB_002b6740;
    }
    local_dc = 0x14;
  }
  goto LAB_002b6f33;
code_r0x002b69e0:
  uVar27 = local_128 + 1;
  if (local_4c <= uVar19) {
    uVar16 = local_128 - 3;
LAB_002b6d51:
    local_118 = (uint *)0x0;
    local_dc = 0xb - (uVar2 < uVar16);
    local_128 = uVar16;
    goto LAB_002b6d78;
  }
  goto LAB_002b69a5;
LAB_002b6ddf:
  local_dc = 0x53;
  local_128 = uVar16;
LAB_002b6740:
  free(puVar13);
  free((void *)local_88._8_8_);
  free(local_78);
  free(local_118);
  free((void *)local_a8._8_8_);
  free(local_98);
  uVar23 = local_128;
LAB_002b67a8:
  bVar14 = bVar14 >> (bVar24 & 7) & 1;
  if (local_dc != 0) {
LAB_002b6f33:
    *local_40 = local_108;
    *local_38 = local_f0;
    return local_dc;
  }
  goto LAB_002b610a;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}